

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

View<int,_false,_std::allocator<unsigned_long>_> * __thiscall
andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
          (View<int,_false,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          View<int,_false,_std::allocator<unsigned_long>_> *this,size_t dimension,size_t value)

{
  geometry_type *this_00;
  ulong uVar1;
  unsigned_long *begin;
  pointer piVar2;
  bool assertion;
  size_t sVar3;
  reference data;
  size_t sVar4;
  size_t *psVar5;
  size_t j;
  ulong dimension_00;
  size_t k;
  allocator_type local_4a;
  allocator_type local_49;
  CoordinateOrder *local_48;
  View<int,_false,_std::allocator<unsigned_long>_> *local_40;
  size_t local_38;
  
  testInvariant(this);
  sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(this);
  if (dimension < sVar3) {
    sVar3 = shape(this,dimension);
    assertion = value < sVar3;
  }
  else {
    assertion = false;
  }
  marray_detail::Assert<bool>(assertion);
  sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(this);
  if (sVar3 == 1) {
    data = operator()(this,value);
    View(__return_storage_ptr__,data,&local_49);
    testInvariant(this);
    (__return_storage_ptr__->geometry_).coordinateOrder_ = (this->geometry_).coordinateOrder_;
  }
  else {
    local_38 = value;
    View(__return_storage_ptr__,&local_4a);
    this_00 = &__return_storage_ptr__->geometry_;
    sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(this);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::resize(this_00,sVar3 - 1);
    testInvariant(this);
    (__return_storage_ptr__->geometry_).coordinateOrder_ = (this->geometry_).coordinateOrder_;
    uVar1 = (this->geometry_).size_;
    sVar3 = shape(this,dimension);
    local_48 = &(__return_storage_ptr__->geometry_).coordinateOrder_;
    dimension_00 = 0;
    (__return_storage_ptr__->geometry_).size_ = uVar1 / sVar3;
    sVar3 = 0;
    local_40 = __return_storage_ptr__;
    while( true ) {
      sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(this);
      __return_storage_ptr__ = local_40;
      if (sVar4 <= dimension_00) break;
      if (dimension != dimension_00) {
        sVar4 = shape(this,dimension_00);
        psVar5 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape(this_00,sVar3);
        *psVar5 = sVar4;
        sVar4 = strides(this,dimension_00);
        psVar5 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides(this_00,sVar3);
        *psVar5 = sVar4;
        sVar3 = sVar3 + 1;
      }
      dimension_00 = dimension_00 + 1;
    }
    begin = (local_40->geometry_).shape_;
    marray_detail::stridesFromShape<unsigned_long*,unsigned_long*>
              (begin,begin + (local_40->geometry_).dimension_,(local_40->geometry_).shapeStrides_,
               local_48);
    piVar2 = this->data_;
    sVar3 = strides(this,dimension);
    __return_storage_ptr__->data_ = piVar2 + sVar3 * local_38;
    marray_detail::Geometry<std::allocator<unsigned_long>_>::updateSimplicity(this_00);
    testInvariant(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

View<T, isConst, A>
View<T, isConst, A>::boundView
(
    const std::size_t dimension,
    const std::size_t value
) const
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_ARG_TEST || (dimension < this->dimension()
        && value < shape(dimension)));
    if(this->dimension() == 1) {
        View v(&((*this)(value)));
        v.geometry_.coordinateOrder() = coordinateOrder();
        return v;
    }
    else {
        View v;
        v.geometry_.resize(this->dimension()-1);
        v.geometry_.coordinateOrder() = coordinateOrder();
        v.geometry_.size() = size() / shape(dimension);
        for(std::size_t j=0, k=0; j<this->dimension(); ++j) {
            if(j != dimension) {
                v.geometry_.shape(k) = shape(j);
                v.geometry_.strides(k) = strides(j);
                ++k;
            }
        }
        marray_detail::stridesFromShape(v.geometry_.shapeBegin(), v.geometry_.shapeEnd(),
            v.geometry_.shapeStridesBegin(), v.geometry_.coordinateOrder());
        v.data_ = data_ + strides(dimension) * value;
        v.updateSimplicity();
        v.testInvariant();
        return v;
    }
}